

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateReplayer::Impl::parse_compute_pipeline
          (Impl *this,StateCreatorInterface *iface,DatabaseInterface *resolver,Value *pipelines,
          Value *member)

{
  StateCreatorInterface *pSVar1;
  undefined8 uVar2;
  ulonglong uVar3;
  bool bVar4;
  SizeType SVar5;
  int iVar6;
  Ch *pCVar7;
  size_type sVar8;
  undefined8 *puVar9;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *this_00;
  Type pGVar10;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *this_01;
  Number NVar11;
  _Hash_node_base *p_Var12;
  void *__dest;
  mapped_type *ppVVar13;
  __node_base_ptr p_Var14;
  ulong uVar15;
  ulong uVar16;
  __node_base_ptr p_Var17;
  __node_base_ptr p_Var18;
  _Hash_node_base *p_Var19;
  uint64_t module;
  size_t external_state_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> external_state;
  Hash hash;
  allocator_type local_79;
  StateCreatorInterface *local_78;
  _Hash_node_base *local_70;
  size_type local_68;
  Data local_60;
  long local_50;
  Ch *local_48;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_VkPipeline_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_40;
  ulonglong local_38;
  
  local_78 = iface;
  pCVar7 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::GetString(member);
  local_38 = strtoull(pCVar7,(char **)0x0,0x10);
  local_40 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_VkPipeline_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)&this->replayed_compute_pipelines;
  sVar8 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkPipeline_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::count((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkPipeline_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)local_40,&local_38);
  if (sVar8 != 0) {
    return true;
  }
  puVar9 = (undefined8 *)ScratchAllocator::allocate_raw(&this->allocator,0x60,0x10);
  if (puVar9 != (undefined8 *)0x0) {
    puVar9[10] = 0;
    puVar9[0xb] = 0;
    puVar9[8] = 0;
    puVar9[9] = 0;
    puVar9[6] = 0;
    puVar9[7] = 0;
    puVar9[4] = 0;
    puVar9[5] = 0;
    puVar9[2] = 0;
    puVar9[3] = 0;
    *puVar9 = 0;
    puVar9[1] = 0;
  }
  this_00 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             *)rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)pipelines,member);
  *(undefined4 *)puVar9 = 0x1d;
  pGVar10 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ::operator[]<char_const>(this_00,"flags");
  pSVar1 = local_78;
  if ((undefined1  [16])((undefined1  [16])pGVar10->data_ & (undefined1  [16])0x40000000000000) ==
      (undefined1  [16])0x0) {
LAB_001602b3:
    __assert_fail("data_.f.flags & kUintFlag",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                  ,0x719,
                  "unsigned int rapidjson::GenericValue<rapidjson::UTF8<>>::GetUint() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                 );
  }
  *(SizeType *)(puVar9 + 2) = (pGVar10->data_).s.length;
  pGVar10 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ::operator[]<char_const>(this_00,"basePipelineIndex");
  if ((undefined1  [16])((undefined1  [16])pGVar10->data_ & (undefined1  [16])0x20000000000000) ==
      (undefined1  [16])0x0) {
    __assert_fail("data_.f.flags & kIntFlag",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                  ,0x718,
                  "int rapidjson::GenericValue<rapidjson::UTF8<>>::GetInt() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                 );
  }
  *(SizeType *)(puVar9 + 0xb) = (pGVar10->data_).s.length;
  *(uint *)(puVar9 + 2) = *(uint *)(puVar9 + 2) & 0x7ffffc3f;
  pGVar10 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ::operator[]<char_const>(this_00,"basePipelineHandle");
  bVar4 = parse_derived_pipeline_handle
                    (this,pSVar1,resolver,pGVar10,pipelines,RESOURCE_COMPUTE_PIPELINE,
                     (VkPipeline *)(puVar9 + 10));
  if (!bVar4) {
    return false;
  }
  pGVar10 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ::operator[]<char_const>(this_00,"layout");
  bVar4 = parse_pipeline_layout_handle(this,pGVar10,(VkPipelineLayout *)(puVar9 + 9));
  if (!bVar4) {
    return false;
  }
  this_01 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             *)rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>(this_00,"stage");
  *(undefined4 *)(puVar9 + 3) = 0x12;
  pGVar10 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ::operator[]<char_const>(this_01,"stage");
  if ((undefined1  [16])((undefined1  [16])pGVar10->data_ & (undefined1  [16])0x40000000000000) ==
      (undefined1  [16])0x0) goto LAB_001602b3;
  *(SizeType *)((long)puVar9 + 0x2c) = (pGVar10->data_).s.length;
  pGVar10 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ::operator[]<char_const>(this_01,"flags");
  if ((undefined1  [16])((undefined1  [16])pGVar10->data_ & (undefined1  [16])0x40000000000000) ==
      (undefined1  [16])0x0) goto LAB_001602b3;
  *(SizeType *)(puVar9 + 5) = (pGVar10->data_).s.length;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_60.s,(Ch *)this_01);
  uVar2 = local_60.n;
  NVar11.i = (I)rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::MemberEnd((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)this_01);
  if (uVar2 != NVar11.i64) {
    pGVar10 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ::operator[]<char_const>(this_01,"pNext");
    bVar4 = parse_pnext_chain(this,pGVar10,(void **)(puVar9 + 4),(StateCreatorInterface *)0x0,
                              (DatabaseInterface *)0x0,(Value *)0x0);
    if (!bVar4) {
      return false;
    }
  }
  pGVar10 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ::operator[]<char_const>(this_01,"module");
  pCVar7 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::GetString(pGVar10);
  p_Var12 = (_Hash_node_base *)strtoull(pCVar7,(char **)0x0,0x10);
  local_70 = p_Var12;
  if ((p_Var12 == (_Hash_node_base *)0x0) || (this->resolve_shader_modules != true))
  goto LAB_00160027;
  uVar16 = (this->replayed_shader_modules)._M_h._M_bucket_count;
  uVar15 = (ulong)p_Var12 % uVar16;
  p_Var17 = (this->replayed_shader_modules)._M_h._M_buckets[uVar15];
  p_Var18 = (__node_base_ptr)0x0;
  if ((p_Var17 != (__node_base_ptr)0x0) &&
     (p_Var19 = p_Var17->_M_nxt, p_Var18 = p_Var17, p_Var12 != p_Var17->_M_nxt[1]._M_nxt)) {
    while (p_Var17 = p_Var19, p_Var19 = p_Var17->_M_nxt, p_Var19 != (_Hash_node_base *)0x0) {
      p_Var18 = (__node_base_ptr)0x0;
      if (((ulong)p_Var19[1]._M_nxt % uVar16 != uVar15) ||
         (p_Var18 = p_Var17, p_Var12 == p_Var19[1]._M_nxt)) goto LAB_0015fffc;
    }
    p_Var18 = (__node_base_ptr)0x0;
  }
LAB_0015fffc:
  if (p_Var18 == (__node_base_ptr)0x0) {
    p_Var19 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var19 = p_Var18->_M_nxt;
  }
  if (p_Var19 == (_Hash_node_base *)0x0) {
    local_68 = 0;
    if ((resolver == (DatabaseInterface *)0x0) ||
       (iVar6 = (*resolver->_vptr_DatabaseInterface[3])(resolver,4,p_Var12,&local_68,0),
       (char)iVar6 == '\0')) {
      log_missing_resource("Shader module",(Hash)local_70);
      return false;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_60.s,local_68,
               &local_79);
    iVar6 = (*resolver->_vptr_DatabaseInterface[3])(resolver,4,local_70,&local_68,local_60.n.i64);
    pSVar1 = local_78;
    if ((char)iVar6 != '\0') {
      bVar4 = parse(this,local_78,resolver,(void *)local_60.n,(long)local_60.s.str - local_60._0_8_)
      ;
      if (!bVar4) goto LAB_0016029a;
      (*pSVar1->_vptr_StateCreatorInterface[0xf])(pSVar1);
      p_Var19 = (_Hash_node_base *)0x0;
      p_Var14 = std::
                _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkShaderModule_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkShaderModule_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::_M_find_before_node
                          (&(this->replayed_shader_modules)._M_h,
                           (ulong)local_70 % (this->replayed_shader_modules)._M_h._M_bucket_count,
                           (key_type *)&local_70,(__hash_code)local_70);
      if (p_Var14 != (__node_base_ptr)0x0) {
        p_Var19 = p_Var14->_M_nxt;
      }
      if (p_Var19 != (_Hash_node_base *)0x0) {
        if (local_60.n.i64 != 0) {
          operator_delete((void *)local_60.n,local_50 - local_60._0_8_);
        }
        goto LAB_00160020;
      }
    }
    log_missing_resource("Shader module",(Hash)local_70);
LAB_0016029a:
    if (local_60.n.i64 != 0) {
      operator_delete((void *)local_60.n,local_50 - local_60._0_8_);
    }
    return false;
  }
  (*local_78->_vptr_StateCreatorInterface[0xf])();
LAB_00160020:
  p_Var12 = p_Var19[2]._M_nxt;
LAB_00160027:
  puVar9[6] = p_Var12;
  pGVar10 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ::operator[]<char_const>(this_01,"name");
  local_48 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::GetString(pGVar10);
  pGVar10 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ::operator[]<char_const>(this_01,"name");
  SVar5 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetStringLength(pGVar10);
  uVar16 = (ulong)SVar5;
  __dest = ScratchAllocator::allocate_raw(&this->allocator,uVar16 + 1,0x10);
  memcpy(__dest,local_48,uVar16);
  *(undefined1 *)((long)__dest + uVar16) = 0;
  puVar9[7] = __dest;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_60.s,(Ch *)this_01);
  uVar2 = local_60.n;
  NVar11.i = (I)rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::MemberEnd((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)this_01);
  if (uVar2 != NVar11.i64) {
    pGVar10 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ::operator[]<char_const>(this_01,"specializationInfo");
    parse_specialization_info(this,pGVar10,(VkSpecializationInfo **)(puVar9 + 8));
  }
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_60.s,(Ch *)this_00);
  NVar11.i = (I)rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::MemberEnd((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)this_00);
  if (local_60.n.i64 != (Number)NVar11.i64) {
    pGVar10 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ::operator[]<char_const>(this_00,"pNext");
    bVar4 = parse_pnext_chain(this,pGVar10,(void **)(puVar9 + 1),(StateCreatorInterface *)0x0,
                              (DatabaseInterface *)0x0,(Value *)0x0);
    if (!bVar4) {
      return false;
    }
  }
  uVar3 = local_38;
  ppVVar13 = std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_VkPipeline_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[](local_40,&local_38);
  iVar6 = (*local_78->_vptr_StateCreatorInterface[0xb])(local_78,uVar3,puVar9,ppVVar13);
  return (bool)(char)iVar6;
}

Assistant:

bool StateReplayer::Impl::parse_compute_pipeline(StateCreatorInterface &iface, DatabaseInterface *resolver,
                                                 const Value &pipelines, const Value &member)
{
	Hash hash = string_to_uint64(member.GetString());
	if (replayed_compute_pipelines.count(hash))
		return true;

	auto *info_allocated = allocator.allocate_cleared<VkComputePipelineCreateInfo>();
	auto &obj = pipelines[member];
	auto &info = *info_allocated;
	info.sType = VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO;
	info.flags = obj["flags"].GetUint();
	info.basePipelineIndex = obj["basePipelineIndex"].GetInt();

	// For older captures, we might have captured these flags.
	info.flags = normalize_pipeline_creation_flags(info.flags);

	if (!parse_derived_pipeline_handle(iface, resolver, obj["basePipelineHandle"], pipelines,
	                                   RESOURCE_COMPUTE_PIPELINE, &info.basePipelineHandle))
		return false;

	if (!parse_pipeline_layout_handle(obj["layout"], &info.layout))
		return false;

	auto &stage = obj["stage"];
	info.stage.sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
	info.stage.stage = static_cast<VkShaderStageFlagBits>(stage["stage"].GetUint());
	info.stage.flags = stage["flags"].GetUint();

	if (stage.HasMember("pNext"))
		if (!parse_pnext_chain(stage["pNext"], &info.stage.pNext))
			return false;

	auto module = string_to_uint64(stage["module"].GetString());
	if (module > 0 && resolve_shader_modules)
	{
		auto module_iter = replayed_shader_modules.find(module);
		if (module_iter == replayed_shader_modules.end())
		{
			size_t external_state_size = 0;
			if (!resolver || !resolver->read_entry(RESOURCE_SHADER_MODULE, module, &external_state_size, nullptr,
			                                       PAYLOAD_READ_NO_FLAGS))
			{
				log_missing_resource("Shader module", module);
				return false;
			}

			vector<uint8_t> external_state(external_state_size);

			if (!resolver->read_entry(RESOURCE_SHADER_MODULE, module, &external_state_size, external_state.data(),
			                          PAYLOAD_READ_NO_FLAGS))
			{
				log_missing_resource("Shader module", module);
				return false;
			}

			if (!this->parse(iface, resolver, external_state.data(), external_state.size()))
				return false;

			iface.sync_shader_modules();
			module_iter = replayed_shader_modules.find(module);
			if (module_iter == replayed_shader_modules.end())
			{
				log_missing_resource("Shader module", module);
				return false;
			}
		}
		else
			iface.sync_shader_modules();
		info.stage.module = module_iter->second;
	}
	else
		info.stage.module = api_object_cast<VkShaderModule>(module);

	info.stage.pName = duplicate_string(stage["name"].GetString(), stage["name"].GetStringLength());
	if (stage.HasMember("specializationInfo"))
		if (!parse_specialization_info(stage["specializationInfo"], &info.stage.pSpecializationInfo))
			return false;

	if (obj.HasMember("pNext"))
		if (!parse_pnext_chain(obj["pNext"], &info.pNext))
			return false;

	if (!iface.enqueue_create_compute_pipeline(hash, &info, &replayed_compute_pipelines[hash]))
		return false;

	return true;
}